

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O0

int Kit_GraphToGia(Gia_Man_t *pMan,Kit_Graph_t *pGraph,Vec_Int_t *vLeaves,int fHash)

{
  int iVar1;
  Kit_Node_t *pKVar2;
  Gia_Obj_t *pObj;
  int local_3c;
  int local_34;
  int i;
  Kit_Node_t *pNode;
  int fHash_local;
  Vec_Int_t *vLeaves_local;
  Kit_Graph_t *pGraph_local;
  Gia_Man_t *pMan_local;
  
  for (local_34 = 0; local_34 < pGraph->nLeaves; local_34 = local_34 + 1) {
    pKVar2 = Kit_GraphNode(pGraph,local_34);
    if (vLeaves == (Vec_Int_t *)0x0) {
      pObj = Gia_ManPi(pMan,local_34);
      local_3c = Gia_Obj2Lit(pMan,pObj);
    }
    else {
      local_3c = Vec_IntEntry(vLeaves,local_34);
    }
    (pKVar2->field_2).iFunc = local_3c;
  }
  iVar1 = Kit_GraphToGiaInternal(pMan,pGraph,fHash);
  return iVar1;
}

Assistant:

int Kit_GraphToGia( Gia_Man_t * pMan, Kit_Graph_t * pGraph, Vec_Int_t * vLeaves, int fHash )
{
    Kit_Node_t * pNode = NULL;
    int i;
    // collect the fanins
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->iFunc = vLeaves ? Vec_IntEntry(vLeaves, i) : Gia_Obj2Lit(pMan, Gia_ManPi(pMan, i));
    // perform strashing
    return Kit_GraphToGiaInternal( pMan, pGraph, fHash );
}